

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_file_system.cpp
# Opt level: O3

bool __thiscall duckdb::MiniZStreamWrapper::Read(MiniZStreamWrapper *this,StreamData *sd)

{
  unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
  *this_00;
  int iVar1;
  data_ptr_t pdVar2;
  ushort *puVar3;
  uchar *puVar4;
  ushort uVar5;
  idx_t iVar6;
  ulong uVar7;
  bool bVar8;
  int iVar9;
  uint err;
  unsigned_long uVar10;
  pointer pmVar11;
  IOException *this_01;
  char *params;
  InternalException *pIVar12;
  ushort *puVar13;
  ushort *puVar14;
  uint8_t gzip_hdr [10];
  string local_58;
  ulong local_38;
  undefined2 local_30;
  
  if (sd->refresh == true) {
    pdVar2 = sd->in_buff_start;
    if (8 < (uint)(*(int *)&sd->in_buff_end - (int)pdVar2)) {
      sd->refresh = false;
      local_30 = *(undefined2 *)(pdVar2 + 0x10);
      local_38 = *(ulong *)(pdVar2 + 8);
      GZipFileSystem::VerifyGZIPHeader
                ((uint8_t *)&local_38,10,(optional_ptr<duckdb::CompressedFile,_true>)0x0);
      uVar7 = local_38;
      puVar13 = (ushort *)(pdVar2 + 0x12);
      if ((local_38 & 0x4000000) != 0) {
        uVar10 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)*puVar13);
        if (uVar10 - 0x7fec < 0xffffffffffff8000) {
          pIVar12 = (InternalException *)__cxa_allocate_exception(0x10);
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,
                     "Extra field resulting in GZIP header larger than defined maximum (%d)","");
          InternalException::InternalException<unsigned_long>(pIVar12,(string *)&local_58,0x8000);
          __cxa_throw(pIVar12,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        puVar13 = (ushort *)((long)puVar13 + uVar10 + 2);
      }
      puVar3 = (ushort *)sd->in_buff_end;
      puVar14 = puVar13;
      if ((uVar7 & 0x8000000) != 0) {
        do {
          puVar13 = (ushort *)((long)puVar13 + 1);
          uVar5 = *puVar14;
          puVar14 = (ushort *)((long)puVar14 + 1);
          if ((char)uVar5 == '\0') break;
        } while (puVar14 < puVar3);
        if (0x7fff < (ulong)((long)puVar13 - (long)sd->in_buff_start)) {
          pIVar12 = (InternalException *)__cxa_allocate_exception(0x10);
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,
                     "Filename resulting in GZIP header larger than defined maximum (%d)","");
          InternalException::InternalException<unsigned_long>(pIVar12,(string *)&local_58,0x8000);
          __cxa_throw(pIVar12,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      sd->in_buff_start = (data_ptr_t)puVar14;
      if (puVar3 != puVar13 && -1 < (long)puVar3 - (long)puVar13) {
        duckdb_miniz::mz_inflateEnd
                  ((this->mz_stream_ptr).
                   super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                   .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl);
        iVar9 = duckdb_miniz::mz_inflateInit2
                          ((this->mz_stream_ptr).
                           super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                           .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl,
                           -0xf);
        if (iVar9 != 0) {
          pIVar12 = (InternalException *)__cxa_allocate_exception(0x10);
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,"Failed to initialize miniz","");
          InternalException::InternalException(pIVar12,&local_58);
          __cxa_throw(pIVar12,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        goto LAB_013e3c93;
      }
    }
    (*(this->super_StreamWrapper)._vptr_StreamWrapper[5])(this);
    bVar8 = true;
  }
  else {
LAB_013e3c93:
    puVar4 = sd->in_buff_start;
    this_00 = &this->mz_stream_ptr;
    pmVar11 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
              ::operator->(this_00);
    pmVar11->next_in = puVar4;
    iVar9 = *(int *)&sd->in_buff_end;
    iVar1 = *(int *)&sd->in_buff_start;
    pmVar11 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
              ::operator->(this_00);
    pmVar11->avail_in = iVar9 - iVar1;
    puVar4 = sd->out_buff_end;
    pmVar11 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
              ::operator->(this_00);
    pmVar11->next_out = puVar4;
    iVar9 = *(int *)&(sd->out_buff).
                     super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    iVar6 = sd->out_buf_size;
    iVar1 = *(int *)&sd->out_buff_end;
    pmVar11 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
              ::operator->(this_00);
    pmVar11->avail_out = (iVar9 + (int)iVar6) - iVar1;
    err = duckdb_miniz::mz_inflate
                    ((this->mz_stream_ptr).
                     super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                     .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl,0);
    if (1 < err) {
      this_01 = (IOException *)__cxa_allocate_exception(0x10);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"Failed to decode gzip stream: %s","");
      params = duckdb_miniz::mz_error(err);
      IOException::IOException<char_const*>(this_01,&local_58,params);
      __cxa_throw(this_01,&IOException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pmVar11 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
              ::operator->(this_00);
    puVar4 = pmVar11->next_in;
    sd->in_buff_start = puVar4;
    pmVar11 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
              ::operator->(this_00);
    sd->in_buff_end = puVar4 + pmVar11->avail_in;
    pmVar11 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
              ::operator->(this_00);
    sd->out_buff_end = pmVar11->next_out;
    if (err == 1) {
      sd->refresh = true;
    }
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool MiniZStreamWrapper::Read(StreamData &sd) {
	// Handling for the concatenated files
	if (sd.refresh) {
		auto available = static_cast<uint32_t>(sd.in_buff_end - sd.in_buff_start);
		if (available <= GZIP_FOOTER_SIZE) {
			// Only footer is available so we just close and return finished
			Close();
			return true;
		}

		sd.refresh = false;
		auto body_ptr = sd.in_buff_start + GZIP_FOOTER_SIZE;
		uint8_t gzip_hdr[GZIP_HEADER_MINSIZE];
		memcpy(gzip_hdr, body_ptr, GZIP_HEADER_MINSIZE);
		GZipFileSystem::VerifyGZIPHeader(gzip_hdr, GZIP_HEADER_MINSIZE, nullptr);
		body_ptr += GZIP_HEADER_MINSIZE;
		if (gzip_hdr[3] & GZIP_FLAG_EXTRA) {
			auto xlen = NumericCast<idx_t>((uint8_t)*body_ptr | (uint8_t) * (body_ptr + 1) << 8);
			body_ptr += xlen + 2;
			if (GZIP_FOOTER_SIZE + GZIP_HEADER_MINSIZE + 2 + xlen >= GZIP_HEADER_MAXSIZE) {
				throw InternalException("Extra field resulting in GZIP header larger than defined maximum (%d)",
				                        GZIP_HEADER_MAXSIZE);
			}
		}
		if (gzip_hdr[3] & GZIP_FLAG_NAME) {
			char c;
			do {
				c = UnsafeNumericCast<char>(*body_ptr);
				body_ptr++;
			} while (c != '\0' && body_ptr < sd.in_buff_end);
			if (static_cast<idx_t>(body_ptr - sd.in_buff_start) >= GZIP_HEADER_MAXSIZE) {
				throw InternalException("Filename resulting in GZIP header larger than defined maximum (%d)",
				                        GZIP_HEADER_MAXSIZE);
			}
		}
		sd.in_buff_start = body_ptr;
		if (sd.in_buff_end - sd.in_buff_start < 1) {
			Close();
			return true;
		}
		duckdb_miniz::mz_inflateEnd(mz_stream_ptr.get());
		auto sta = duckdb_miniz::mz_inflateInit2(mz_stream_ptr.get(), -MZ_DEFAULT_WINDOW_BITS);
		if (sta != duckdb_miniz::MZ_OK) {
			throw InternalException("Failed to initialize miniz");
		}
	}

	// actually decompress
	mz_stream_ptr->next_in = sd.in_buff_start;
	D_ASSERT(sd.in_buff_end - sd.in_buff_start < NumericLimits<int32_t>::Maximum());
	mz_stream_ptr->avail_in = static_cast<uint32_t>(sd.in_buff_end - sd.in_buff_start);
	mz_stream_ptr->next_out = data_ptr_cast(sd.out_buff_end);
	mz_stream_ptr->avail_out = static_cast<uint32_t>((sd.out_buff.get() + sd.out_buf_size) - sd.out_buff_end);
	auto ret = duckdb_miniz::mz_inflate(mz_stream_ptr.get(), duckdb_miniz::MZ_NO_FLUSH);
	if (ret != duckdb_miniz::MZ_OK && ret != duckdb_miniz::MZ_STREAM_END) {
		throw IOException("Failed to decode gzip stream: %s", duckdb_miniz::mz_error(ret));
	}
	// update pointers following inflate()
	sd.in_buff_start = (data_ptr_t)mz_stream_ptr->next_in; // NOLINT
	sd.in_buff_end = sd.in_buff_start + mz_stream_ptr->avail_in;
	sd.out_buff_end = data_ptr_cast(mz_stream_ptr->next_out);
	D_ASSERT(sd.out_buff_end + mz_stream_ptr->avail_out == sd.out_buff.get() + sd.out_buf_size);

	// if stream ended, deallocate inflator
	if (ret == duckdb_miniz::MZ_STREAM_END) {
		// Concatenated GZIP potentially coming up - refresh input buffer
		sd.refresh = true;
	}
	return false;
}